

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

DataSegment * __thiscall wabt::Module::GetDataSegment(Module *this,Var *var)

{
  DataSegment *pDVar1;
  
  pDVar1 = GetDataSegment(this,var);
  return pDVar1;
}

Assistant:

const DataSegment* Module::GetDataSegment(const Var& var) const {
  return const_cast<Module*>(this)->GetDataSegment(var);
}